

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalRecursiveCTE::Deserialize(LogicalRecursiveCTE *this,Deserializer *deserializer)

{
  LogicalRecursiveCTE *this_00;
  pointer pLVar1;
  _Head_base<0UL,_duckdb::LogicalRecursiveCTE_*,_false> local_20;
  
  this_00 = (LogicalRecursiveCTE *)operator_new(200);
  LogicalRecursiveCTE(this_00);
  local_20._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,200,"union_all",(bool *)&(pLVar1->super_LogicalOperator).field_0x61);
  pLVar1 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xc9,"ctename",&pLVar1->ctename);
  pLVar1 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xca,"table_index",&pLVar1->table_index);
  pLVar1 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<unsigned_long>
            (deserializer,0xcb,"column_count",&pLVar1->column_count);
  pLVar1 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (deserializer,0xcc,"key_targets",&pLVar1->key_targets);
  pLVar1 = unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
           ::operator->((unique_ptr<duckdb::LogicalRecursiveCTE,_std::default_delete<duckdb::LogicalRecursiveCTE>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xcd,"ref_recurring",(bool *)&(pLVar1->super_LogicalOperator).field_0x62);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalRecursiveCTE::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LogicalRecursiveCTE>(new LogicalRecursiveCTE());
	deserializer.ReadPropertyWithDefault<bool>(200, "union_all", result->union_all);
	deserializer.ReadPropertyWithDefault<string>(201, "ctename", result->ctename);
	deserializer.ReadPropertyWithDefault<idx_t>(202, "table_index", result->table_index);
	deserializer.ReadPropertyWithDefault<idx_t>(203, "column_count", result->column_count);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<Expression>>>(204, "key_targets", result->key_targets);
	deserializer.ReadPropertyWithDefault<bool>(205, "ref_recurring", result->ref_recurring);
	return std::move(result);
}